

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void resizeline(Terminal *term,termline *line,wchar_t cols)

{
  unsigned_long *puVar1;
  truecolour *ptVar2;
  wchar_t wVar3;
  int iVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined4 uVar7;
  termchar *ptVar8;
  ulong uVar9;
  long lVar10;
  wchar_t col;
  int iVar11;
  size_t n;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  wVar3 = line->cols;
  lVar12 = (long)wVar3;
  col = cols;
  if (cols != wVar3) {
    for (; col < wVar3; col = col + L'\x01') {
      clear_cc(line,col);
    }
    lVar13 = (long)cols;
    if (cols < wVar3) {
      memmove(line->chars + lVar13,line->chars + lVar12,((long)line->size - (long)line->cols) * 0x20
             );
    }
    n = (long)(cols - wVar3) + (long)line->size;
    line->size = (wchar_t)n;
    ptVar8 = (termchar *)saferealloc(line->chars,n,0x20);
    line->chars = ptVar8;
    line->cols = cols;
    iVar11 = cols - wVar3;
    if (iVar11 != 0 && wVar3 <= cols) {
      memmove(ptVar8 + lVar13,ptVar8 + lVar12,(line->size - lVar13) * 0x20);
    }
    if (wVar3 < cols) {
      cols = wVar3;
    }
    uVar9 = 0;
    uVar14 = (ulong)(uint)cols;
    if (cols < L'\x01') {
      uVar14 = uVar9;
    }
    for (; uVar14 * 0x20 != uVar9; uVar9 = uVar9 + 0x20) {
      iVar4 = *(int *)((long)&line->chars->cc_next + uVar9);
      if (iVar4 != 0) {
        *(int *)((long)&line->chars->cc_next + uVar9) = iVar4 + iVar11;
      }
    }
    if (line->cc_free != L'\0') {
      line->cc_free = line->cc_free + iVar11;
    }
    lVar10 = lVar12 << 5;
    for (; lVar12 < lVar13; lVar12 = lVar12 + 1) {
      ptVar8 = line->chars;
      uVar5 = (term->basic_erase_char).chr;
      uVar6 = (term->basic_erase_char).attr;
      wVar3 = (term->basic_erase_char).cc_next;
      uVar7 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
      ptVar2 = (truecolour *)(&(ptVar8->truecolour).fg.enabled + lVar10);
      *ptVar2 = (term->basic_erase_char).truecolour;
      ptVar2[1].fg.enabled = (_Bool)(char)wVar3;
      ptVar2[1].fg.r = (char)((uint)wVar3 >> 8);
      ptVar2[1].fg.g = (char)((uint)wVar3 >> 0x10);
      ptVar2[1].fg.b = (char)((uint)wVar3 >> 0x18);
      ptVar2[1].bg.enabled = (_Bool)(char)uVar7;
      ptVar2[1].bg.r = (char)((uint)uVar7 >> 8);
      ptVar2[1].bg.g = (char)((uint)uVar7 >> 0x10);
      ptVar2[1].bg.b = (char)((uint)uVar7 >> 0x18);
      puVar1 = (unsigned_long *)((long)&ptVar8->chr + lVar10);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar10 = lVar10 + 0x20;
    }
  }
  return;
}

Assistant:

static void resizeline(Terminal *term, termline *line, int cols)
{
    int i, oldcols;

    if (line->cols != cols) {

        oldcols = line->cols;

        /*
         * This line is the wrong length, which probably means it
         * hasn't been accessed since a resize. Resize it now.
         *
         * First, go through all the characters that will be thrown
         * out in the resize (if we're shrinking the line) and
         * return their cc lists to the cc free list.
         */
        for (i = cols; i < oldcols; i++)
            clear_cc(line, i);

        /*
         * If we're shrinking the line, we now bodily move the
         * entire cc section from where it started to where it now
         * needs to be. (We have to do this before the resize, so
         * that the data we're copying is still there. However, if
         * we're expanding, we have to wait until _after_ the
         * resize so that the space we're copying into is there.)
         */
        if (cols < oldcols)
            memmove(line->chars + cols, line->chars + oldcols,
                    (line->size - line->cols) * TSIZE);

        /*
         * Now do the actual resize, leaving the _same_ amount of
         * cc space as there was to begin with.
         */
        line->size += cols - oldcols;
        line->chars = sresize(line->chars, line->size, TTYPE);
        line->cols = cols;

        /*
         * If we're expanding the line, _now_ we move the cc
         * section.
         */
        if (cols > oldcols)
            memmove(line->chars + cols, line->chars + oldcols,
                    (line->size - line->cols) * TSIZE);

        /*
         * Go through what's left of the original line, and adjust
         * the first cc_next pointer in each list. (All the
         * subsequent ones are still valid because they are
         * relative offsets within the cc block.) Also do the same
         * to the head of the cc_free list.
         */
        for (i = 0; i < oldcols && i < cols; i++)
            if (line->chars[i].cc_next)
                line->chars[i].cc_next += cols - oldcols;
        if (line->cc_free)
            line->cc_free += cols - oldcols;

        /*
         * And finally fill in the new space with erase chars. (We
         * don't have to worry about cc lists here, because we
         * _know_ the erase char doesn't have one.)
         */
        for (i = oldcols; i < cols; i++)
            line->chars[i] = term->basic_erase_char;

#ifdef TERM_CC_DIAGS
        cc_check(line);
#endif
    }
}